

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

void * setup_malloc(vorb *f,int sz)

{
  uint uVar1;
  int in_ESI;
  long in_RDI;
  void *p;
  undefined8 local_28;
  undefined8 local_8;
  
  uVar1 = in_ESI + 7U & 0xfffffff8;
  *(uint *)(in_RDI + 8) = uVar1 + *(int *)(in_RDI + 8);
  if (*(long *)(in_RDI + 0x80) == 0) {
    if (uVar1 == 0) {
      local_28 = (void *)0x0;
    }
    else {
      local_28 = malloc((long)(int)uVar1);
    }
    local_8 = local_28;
  }
  else {
    local_8 = (void *)(*(long *)(in_RDI + 0x80) + (long)*(int *)(in_RDI + 0x90));
    if (*(int *)(in_RDI + 0x94) < (int)(*(int *)(in_RDI + 0x90) + uVar1)) {
      local_8 = (void *)0x0;
    }
    else {
      *(uint *)(in_RDI + 0x90) = uVar1 + *(int *)(in_RDI + 0x90);
    }
  }
  return local_8;
}

Assistant:

static void *setup_malloc(vorb *f, int sz)
{
   sz = (sz+7) & ~7; // round up to nearest 8 for alignment of future allocs.
   f->setup_memory_required += sz;
   if (f->alloc.alloc_buffer) {
      void *p = (char *) f->alloc.alloc_buffer + f->setup_offset;
      if (f->setup_offset + sz > f->temp_offset) return NULL;
      f->setup_offset += sz;
      return p;
   }
   return sz ? malloc(sz) : NULL;
}